

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
google::protobuf::internal::GenerateEnumData
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          internal *this,Span<const_int> values)

{
  pointer piVar1;
  long lVar2;
  internal *piVar3;
  unsigned_long v1;
  long lVar4;
  int iVar5;
  int *piVar6;
  uint *puVar7;
  bool bVar8;
  pointer piVar9;
  ulong uVar10;
  Nonnull<const_char_*> pcVar11;
  pointer piVar12;
  ulong v1_00;
  pointer piVar13;
  int *piVar14;
  ulong uVar15;
  uint uVar16;
  ulong unaff_R15;
  size_t __n;
  int32_t v;
  vector<int,_std::allocator<int>_> fallback_values_after_bitmap;
  vector<int,_std::allocator<int>_> fallback_values_too_large;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bitmap_values;
  ushort local_da;
  vector<int,_std::allocator<int>_> local_d8;
  int *local_b8;
  iterator iStack_b0;
  int *local_a8;
  int *local_98;
  iterator iStack_90;
  int *local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  EytzingerLayoutSorter local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  piVar13 = values.ptr_;
  piVar12 = (pointer)0x0;
  do {
    if ((pointer)((long)piVar13 + ((ulong)(piVar13 == (pointer)0x0) - 1)) == piVar12)
    goto LAB_001fd108;
    piVar1 = (pointer)((long)piVar12 + 1);
    lVar2 = (long)piVar12 * 4;
    lVar4 = (long)piVar12 * 4;
    piVar12 = piVar1;
  } while (*(int *)(this + lVar2) < *(int *)(this + lVar4 + 4));
  if (piVar1 < piVar13) {
    GenerateEnumData((internal *)&local_60);
  }
  else {
LAB_001fd108:
    local_98 = (int *)0x0;
    iStack_90._M_current = (int *)0x0;
    unaff_R15 = 0;
    local_88 = (int *)0x0;
    local_a8 = (int *)0x0;
    local_b8 = (int *)0x0;
    iStack_b0._M_current = (int *)0x0;
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (piVar13 == (pointer)0x0) {
      uVar16 = 0;
      unaff_R15 = 0;
LAB_001fd38d:
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_98;
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iStack_90._M_current;
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = local_88;
      local_98 = (int *)0x0;
      iStack_90._M_current = (int *)0x0;
      local_88 = (int *)0x0;
    }
    else {
      piVar3 = this + (long)piVar13 * 4;
      bVar8 = false;
      local_38 = __return_storage_ptr__;
      do {
        iVar5 = *(int *)this;
        local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,iVar5);
        if (bVar8) {
          uVar16 = (uint)unaff_R15;
          if ((uVar16 < 0xffff) && (iVar5 == (int)(short)local_da + uVar16)) {
            unaff_R15 = (ulong)(uVar16 + 1);
          }
          else {
            uVar15 = (long)iVar5 - (unaff_R15 + (long)(short)local_da);
            if ((long)uVar15 < 0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_60,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                         ,0x8a,"a >= 0");
              goto LAB_001fd567;
            }
            uVar10 = ((long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start) * 8;
            if (uVar10 < uVar15 || uVar10 - uVar15 == 0) {
              if (uVar15 < 0xffe0) {
                uVar10 = (long)local_78.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_78.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2;
                v1_00 = uVar15 + 0x20 >> 5;
                if (v1_00 <= ((long)iStack_b0._M_current - (long)local_b8 >> 2) + uVar10 + 1) {
                  if (uVar10 < v1_00) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                              (&local_78,v1_00);
                    piVar14 = local_b8;
                    if (local_b8 != iStack_b0._M_current) {
                      do {
                        uVar10 = (long)*piVar14 - (unaff_R15 + (long)(short)local_da);
                        if ((long)uVar10 < 0) {
                          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                    ((LogMessageFatal *)&local_60,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                                     ,0x8a,"a >= 0");
                          goto LAB_001fd567;
                        }
                        local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar10 >> 5 & 0x7ffffff] =
                             local_78.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar10 >> 5 & 0x7ffffff] |
                             1 << ((byte)uVar10 & 0x1f);
                        piVar14 = piVar14 + 1;
                      } while (piVar14 != iStack_b0._M_current);
                      if (local_b8 != iStack_b0._M_current) {
                        iStack_b0._M_current = local_b8;
                      }
                    }
                    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar15 >> 5] =
                         local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar15 >> 5] |
                         1 << ((byte)uVar15 & 0x1f);
                    goto LAB_001fd2e3;
                  }
                  pcVar11 = absl::lts_20250127::log_internal::
                            MakeCheckOpString<unsigned_long,unsigned_long>
                                      (v1_00,uVar10,"rounded_bitmap_size > bitmap_values.size()");
                  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)&local_60,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                             ,0xa9,pcVar11);
                  goto LAB_001fd567;
                }
              }
              if (iStack_b0._M_current == local_a8) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_b8,iStack_b0,(int *)&local_d8);
              }
              else {
                *iStack_b0._M_current = iVar5;
                iStack_b0._M_current = iStack_b0._M_current + 1;
              }
            }
            else {
              if ((long)iStack_b0._M_current - (long)local_b8 != 0) {
                pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,long>
                                    ((long)iStack_b0._M_current - (long)local_b8 >> 2,0,
                                     "fallback_values_after_bitmap.size() == 0");
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&local_60,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                           ,0x98,pcVar11);
                goto LAB_001fd567;
              }
              local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15 >> 5] =
                   local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar15 >> 5] | 1 << ((byte)uVar15 & 0x1f);
            }
          }
        }
        else if ((short)(ushort)iVar5 == iVar5) {
          bVar8 = true;
          unaff_R15 = 1;
          local_da = (ushort)iVar5;
        }
        else if (iStack_90._M_current == local_88) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_98,iStack_90,(int *)&local_d8);
        }
        else {
          *iStack_90._M_current = iVar5;
          iStack_90._M_current = iStack_90._M_current + 1;
        }
LAB_001fd2e3:
        __return_storage_ptr__ = local_38;
        this = this + 4;
      } while (this != piVar3);
      piVar14 = local_b8;
      piVar6 = iStack_b0._M_current;
      uVar16 = 0;
      if (bVar8) {
        uVar16 = (uint)local_da;
      }
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      if (local_b8 == iStack_b0._M_current) goto LAB_001fd38d;
      if (local_98 == iStack_90._M_current) {
        local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = local_a8;
        local_b8 = (int *)0x0;
        iStack_b0._M_current = (int *)0x0;
        local_a8 = (int *)0x0;
        local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = piVar14;
        local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar6;
      }
      else {
        std::vector<int,_std::allocator<int>_>::resize
                  (&local_d8,
                   ((long)iStack_b0._M_current - (long)local_b8 >> 2) +
                   ((long)iStack_90._M_current - (long)local_98 >> 2));
        std::
        __merge<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_98,iStack_90._M_current,local_b8,iStack_b0._M_current,
                   local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start);
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,
               ((long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) +
               ((long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) + 2,(allocator_type *)&local_60
              );
    piVar9 = local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if ((uint)unaff_R15 < 0x10000) {
      puVar7 = (__return_storage_ptr__->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *puVar7 = uVar16 | (uint)unaff_R15 << 0x10;
      __n = (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      v1 = __n * 8;
      uVar15 = (ulong)((uint)v1 & 0xffe0);
      if (v1 - uVar15 == 0) {
        local_60.input.len_ =
             (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
        if (local_60.input.len_ < 0x10000) {
          puVar7[1] = ((uint)((long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) & 0xfffffffc) << 0xe |
                      (int)__n * 8 & 0xffffffe0U;
          if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            memmove(puVar7 + 2,
                    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,__n);
            local_60.input.len_ =
                 (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)piVar9 >> 2;
          }
          local_60.output.ptr_ = (pointer)((long)(puVar7 + 2) + __n);
          local_60.input.ptr_ = piVar9;
          local_60.i = 0;
          local_60.output.len_ = local_60.input.len_;
          EytzingerLayoutSorter::Sort(&local_60,0);
          if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (int *)0x0) {
            operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_b8 != (int *)0x0) {
            operator_delete(local_b8,(long)local_a8 - (long)local_b8);
          }
          if (local_98 != (int *)0x0) {
            operator_delete(local_98,(long)local_88 - (long)local_98);
          }
          return __return_storage_ptr__;
        }
        pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,long>
                            (local_60.input.len_,local_60.input.len_ & 0xffff,
                             "fallback_values.size() == static_cast<uint16_t>(fallback_values.size())"
                            );
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_60,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                   ,0xcf,pcVar11);
      }
      else {
        pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,long>
                            (v1,uVar15,
                             "kBitmapBlockSize * bitmap_values.size() == static_cast<uint16_t>(kBitmapBlockSize * bitmap_values.size())"
                            );
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_60,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                   ,0xcd,pcVar11);
      }
      goto LAB_001fd567;
    }
  }
  pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                      (unaff_R15 & 0xffffffff,unaff_R15 & 0xffff,
                       "sequence_length == static_cast<uint16_t>(sequence_length)");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
             ,200,pcVar11);
LAB_001fd567:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_60);
}

Assistant:

std::vector<uint32_t> GenerateEnumData(absl::Span<const int32_t> values) {
  const auto sorted_and_unique = [&] {
    for (size_t i = 0; i + 1 < values.size(); ++i) {
      if (values[i] >= values[i + 1]) return false;
    }
    return true;
  };
  ABSL_DCHECK(sorted_and_unique());
  std::vector<int32_t> fallback_values_too_large, fallback_values_after_bitmap;
  std::vector<uint32_t> bitmap_values;
  constexpr size_t kBitmapBlockSize = 32;
  absl::optional<int16_t> start_sequence;
  uint32_t sequence_length = 0;
  for (int32_t v : values) {
    // If we don't yet have a sequence, start it.
    if (!start_sequence.has_value()) {
      // But only if we can fit it in the sequence.
      if (static_cast<int16_t>(v) != v) {
        fallback_values_too_large.push_back(v);
        continue;
      }

      start_sequence = v;
      sequence_length = 1;
      continue;
    }
    // If we can extend the sequence, do so.
    if (v == static_cast<int32_t>(*start_sequence) +
                 static_cast<int32_t>(sequence_length) &&
        sequence_length < 0xFFFF) {
      ++sequence_length;
      continue;
    }

    // We adjust the bitmap values to be relative to the end of the sequence.
    const auto adjust = [&](int32_t v) -> uint32_t {
      // Cast to int64_t first to avoid overflow. The result is guaranteed to be
      // positive and fit in uint32_t.
      int64_t a = static_cast<int64_t>(v) - *start_sequence - sequence_length;
      ABSL_DCHECK(a >= 0);
      ABSL_DCHECK_EQ(a, static_cast<uint32_t>(a));
      return a;
    };
    const uint32_t adjusted = adjust(v);

    const auto add_bit = [&](uint32_t bit) {
      bitmap_values[bit / kBitmapBlockSize] |= uint32_t{1}
                                               << (bit % kBitmapBlockSize);
    };

    // If we can fit it on the already allocated bitmap, do so.
    if (adjusted < kBitmapBlockSize * bitmap_values.size()) {
      // We can fit it in the existing bitmap.
      ABSL_DCHECK_EQ(fallback_values_after_bitmap.size(), 0);
      add_bit(adjusted);
      continue;
    }

    // We can't fit in the sequence and we can't fit in the current bitmap.
    // Evaluate if it is better to add to fallback, or to collapse all the
    // fallback values after the bitmap into the bitmap.
    const size_t cost_if_fallback =
        bitmap_values.size() + (1 + fallback_values_after_bitmap.size());
    const size_t rounded_bitmap_size =
        (adjusted + kBitmapBlockSize) / kBitmapBlockSize;
    const size_t cost_if_collapse = rounded_bitmap_size;

    if (cost_if_collapse <= cost_if_fallback &&
        kBitmapBlockSize * rounded_bitmap_size < 0x10000) {
      // Collapse the existing values, and add the new one.
      ABSL_DCHECK_GT(rounded_bitmap_size, bitmap_values.size());
      bitmap_values.resize(rounded_bitmap_size);
      for (int32_t to_collapse : fallback_values_after_bitmap) {
        add_bit(adjust(to_collapse));
      }
      fallback_values_after_bitmap.clear();
      add_bit(adjusted);
    } else {
      fallback_values_after_bitmap.push_back(v);
    }
  }

  std::vector<int32_t> fallback_values;
  if (fallback_values_after_bitmap.empty()) {
    fallback_values = std::move(fallback_values_too_large);
  } else if (fallback_values_too_large.empty()) {
    fallback_values = std::move(fallback_values_after_bitmap);
  } else {
    fallback_values.resize(fallback_values_too_large.size() +
                           fallback_values_after_bitmap.size());
    std::merge(fallback_values_too_large.begin(),
               fallback_values_too_large.end(),
               fallback_values_after_bitmap.begin(),
               fallback_values_after_bitmap.end(), &fallback_values[0]);
  }

  std::vector<uint32_t> output(
      2 /* seq start + seq len + bitmap len + ordered len */ +
      bitmap_values.size() + fallback_values.size());
  uint32_t* p = output.data();

  ABSL_DCHECK_EQ(sequence_length, static_cast<uint16_t>(sequence_length));
  *p++ = uint32_t{static_cast<uint16_t>(start_sequence.value_or(0))} |
         (uint32_t{sequence_length} << 16);
  ABSL_DCHECK_EQ(
      kBitmapBlockSize * bitmap_values.size(),
      static_cast<uint16_t>(kBitmapBlockSize * bitmap_values.size()));
  ABSL_DCHECK_EQ(fallback_values.size(),
                 static_cast<uint16_t>(fallback_values.size()));
  *p++ = static_cast<uint32_t>(kBitmapBlockSize * bitmap_values.size()) |
         static_cast<uint32_t>(fallback_values.size() << 16);
  p = std::copy(bitmap_values.begin(), bitmap_values.end(), p);

  EytzingerLayoutSorter{fallback_values,
                        absl::MakeSpan(p, fallback_values.size())}
      .Sort();

  return output;
}